

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

MIR_item_t get_string_data(c2m_ctx_t c2m_ctx,node_t_conflict n)

{
  node_code_t nVar1;
  MIR_context_t ctx;
  MIR_module_t module;
  MIR_type_t el_type;
  DLIST_MIR_module_t *pDVar2;
  MIR_item_t item;
  size_t nel;
  char *els;
  MIR_str_t str;
  char buff [50];
  
  ctx = c2m_ctx->ctx;
  pDVar2 = MIR_get_module_list(ctx);
  module = pDVar2->tail;
  _MIR_get_temp_item_name(ctx,module,buff,0x32);
  nVar1 = n->code;
  if (nVar1 == N_STR32) {
    els = (n->u).s.s;
    nel = (n->u).s.len >> 2;
    el_type = MIR_T_U32;
  }
  else {
    if (nVar1 != N_STR16) {
      if (nVar1 != N_STR) {
        __assert_fail("n->code == N_STR16 || n->code == N_STR32",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2e2b,"MIR_item_t get_string_data(c2m_ctx_t, node_t)");
      }
      str.s = (n->u).s.s;
      str.len = (n->u).s.len;
      item = MIR_new_string_data(ctx,buff,str);
      goto LAB_00172903;
    }
    els = (n->u).s.s;
    nel = (n->u).s.len >> 1;
    el_type = MIR_T_U16;
  }
  item = MIR_new_data(ctx,buff,el_type,nel,els);
LAB_00172903:
  move_item_to_module_start(module,item);
  return item;
}

Assistant:

static MIR_item_t get_string_data (c2m_ctx_t c2m_ctx, node_t n) {
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_item_t data;
  char buff[50];
  MIR_module_t module = DLIST_TAIL (MIR_module_t, *MIR_get_module_list (ctx));

  _MIR_get_temp_item_name (ctx, module, buff, sizeof (buff));
  if (n->code == N_STR) {
    data = MIR_new_string_data (ctx, buff, (MIR_str_t){n->u.s.len, n->u.s.s});
  } else {
    assert (n->code == N_STR16 || n->code == N_STR32);
    if (n->code == N_STR16) {
      data = MIR_new_data (ctx, buff, MIR_T_U16, n->u.s.len / 2, n->u.s.s);
    } else {
      data = MIR_new_data (ctx, buff, MIR_T_U32, n->u.s.len / 4, n->u.s.s);
    }
  }
  move_item_to_module_start (module, data);
  return data;
}